

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

void __thiscall
vmips::ArrayAccess::ArrayAccess
          (ArrayAccess *this,shared_ptr<vmips::VirtReg> *target,shared_ptr<vmips::VirtReg> *offset,
          shared_ptr<vmips::MemoryLocation> *location)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  peVar1 = (location->super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (location->super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->super_Memory).super_Instruction._vptr_Instruction =
       (_func_int **)&PTR_collect_register_0013de40;
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (location->super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (location->super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Memory).target.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar3;
  (this->super_Memory).target.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  local_28 = 0;
  (this->super_Memory).location.
  super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Memory).location.
  super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  (this->super_Memory).super_Instruction._vptr_Instruction =
       (_func_int **)&PTR_collect_register_0013e230;
  (this->offset).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (offset->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (offset->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (offset->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->offset).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->offset).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (offset->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

ArrayAccess::ArrayAccess(std::shared_ptr<VirtReg> target, std::shared_ptr<VirtReg> offset,
                         std::shared_ptr<MemoryLocation> location) : Memory(std::move(target), std::move(location)),
                                                                     offset(std::move(offset)) {
}